

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> * __thiscall
Clara::CommandLine<Catch::ConfigData>::populateOptions
          (vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  string *shortName;
  value_type *__x;
  pointer pAVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  bool bVar3;
  Type TVar4;
  pointer pTVar5;
  domain_error *this_00;
  pointer this_01;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [5];
  
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = (tokens->super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((tokens->super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
      _M_impl.super__Vector_impl_data._M_finish != pTVar5) {
    uVar6 = 0;
    do {
      __x = pTVar5 + uVar6;
      this_01 = (this->m_options).
                super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pAVar1 = (this->m_options).
               super__Vector_base<Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Clara::CommandLine<Catch::ConfigData>::Arg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (this_01 == pAVar1) {
LAB_0013e02d:
        if (this_01 == pAVar1) goto LAB_0013e032;
      }
      else {
        shortName = &__x->data;
        do {
          TVar4 = __x->type;
          if (TVar4 == ShortOpt) {
            bVar3 = Arg::hasShortName(this_01,shortName);
            if (!bVar3) {
              TVar4 = __x->type;
              goto LAB_0013dfa7;
            }
LAB_0013dfc9:
            if ((this_01->hint)._M_string_length == 0) {
              pIVar2 = (this_01->boundField).functionObj;
              (*pIVar2->_vptr_IArgFunction[3])(pIVar2,config);
            }
            else {
              pTVar5 = (tokens->
                       super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              if ((uVar6 == ((long)(tokens->
                                   super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3)
                            * -0x3333333333333333 - 1U) ||
                 (uVar6 = uVar6 + 1, pTVar5[uVar6].type != Positional)) {
                this_00 = (domain_error *)__cxa_allocate_exception(0x10);
                std::operator+(local_d0,"Expected argument to option ",shortName);
                std::domain_error::domain_error(this_00,(string *)local_d0);
                __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
              }
              pIVar2 = (this_01->boundField).functionObj;
              (*pIVar2->_vptr_IArgFunction[2])(pIVar2,config,&pTVar5[uVar6].data);
            }
            goto LAB_0013e02d;
          }
LAB_0013dfa7:
          if ((TVar4 == LongOpt) && (bVar3 = Arg::hasLongName(this_01,shortName), bVar3))
          goto LAB_0013dfc9;
          this_01 = this_01 + 1;
        } while (this_01 != pAVar1);
LAB_0013e032:
        std::vector<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>::push_back
                  (__return_storage_ptr__,__x);
      }
      uVar6 = uVar6 + 1;
      pTVar5 = (tokens->
               super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>).
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)(((long)(tokens->
                                    super__Vector_base<Clara::Parser::Token,_std::allocator<Clara::Parser::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3)
                            * -0x3333333333333333));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateOptions( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::vector<Arg>::const_iterator it = m_options.begin(), itEnd = m_options.end();
                for(; it != itEnd; ++it ) {
                    Arg const& arg = *it;

                    try {
                        if( ( token.type == Parser::Token::ShortOpt && arg.hasShortName( token.data ) ) ||
                            ( token.type == Parser::Token::LongOpt && arg.hasLongName( token.data ) ) ) {
                            if( arg.takesArg() ) {
                                if( i == tokens.size()-1 || tokens[i+1].type != Parser::Token::Positional )
                                    throw std::domain_error( "Expected argument to option " + token.data );
                                arg.boundField.set( config, tokens[++i].data );
                            }
                            else {
                                arg.boundField.setFlag( config );
                            }
                            break;
                        }
                    }
                    catch( std::exception& ex ) {
                        throw std::runtime_error( std::string( ex.what() ) + "\n- while parsing: (" + arg.commands() + ")" );
                    }
                }
                if( it == itEnd )
                    unusedTokens.push_back( token );
            }
            return unusedTokens;
        }